

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mctools_is_dir(mcu8str *rawpath)

{
  int iVar1;
  int res;
  stat sinfo;
  mcu8str native;
  char buf [4096];
  mcu8str path;
  mcu8str *in_stack_ffffffffffffef30;
  mcu8str *in_stack_ffffffffffffef38;
  mcu8str *in_stack_ffffffffffffef40;
  uint local_10b8;
  char *local_1040;
  
  mctools_impl_view_no_winnamespace(in_stack_ffffffffffffef30);
  mcu8str_create_from_staticbuffer
            ((char *)in_stack_ffffffffffffef40,(mcu8str_size_t)in_stack_ffffffffffffef38);
  mcu8str_assign(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
  mctools_pathseps_platform(in_stack_ffffffffffffef30);
  iVar1 = stat(local_1040,(stat *)&stack0xffffffffffffef30);
  mcu8str_dealloc(in_stack_ffffffffffffef30);
  return (uint)(iVar1 == 0 && (local_10b8 & 0xf000) == 0x4000);
}

Assistant:

int mctools_is_dir( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD fa = GetFileAttributesW( wpath.c_str );
    mc_winstr_dealloc( &wpath );
    if ( fa == INVALID_FILE_ATTRIBUTES )
      return 0;
    return ( fa & FILE_ATTRIBUTE_DIRECTORY) ? 1 : 0;
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    struct stat sinfo;
    int res = ( stat( native.c_str, &sinfo) == 0
                && S_ISDIR(sinfo.st_mode) ) ? 1 : 0;
    mcu8str_dealloc(&native);
    return res;
#endif
  }